

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

void __thiscall
FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
          (FillableSigningProvider *this,CPubKey *pubkey)

{
  bool bVar1;
  mapped_type *this_00;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  CScriptID id;
  CScript script;
  CKeyID key_id;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  CScript *in_stack_ffffffffffffff00;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_ffffffffffffff08;
  CScriptID *this_01;
  key_type *__k;
  CScriptID local_a4;
  key_type local_90 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffefc,(AnnotatedMixin<std::recursive_mutex> *)0x327f7c);
  CPubKey::GetID(in_RDI);
  bVar1 = CPubKey::IsCompressed
                    ((CPubKey *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (bVar1) {
    this_01 = &local_a4;
    WitnessV0KeyHash::WitnessV0KeyHash
              ((WitnessV0KeyHash *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (uint160 *)0x327fb8);
    __k = local_90;
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
              (in_stack_ffffffffffffff08,(WitnessV0KeyHash *)in_stack_ffffffffffffff00);
    GetScriptForDestination
              ((CTxDestination *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    CScriptID::CScriptID(this_01,(CScript *)in_stack_ffffffffffffff08);
    this_00 = std::
              map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
              ::operator[]((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                            *)in_RDI,__k);
    CScript::operator=(this_00,in_stack_ffffffffffffff00);
    CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts(const CPubKey& pubkey)
{
    AssertLockHeld(cs_KeyStore);
    CKeyID key_id = pubkey.GetID();
    // This adds the redeemscripts necessary to detect P2WPKH and P2SH-P2WPKH
    // outputs. Technically P2WPKH outputs don't have a redeemscript to be
    // spent. However, our current IsMine logic requires the corresponding
    // P2SH-P2WPKH redeemscript to be present in the wallet in order to accept
    // payment even to P2WPKH outputs.
    // Also note that having superfluous scripts in the keystore never hurts.
    // They're only used to guide recursion in signing and IsMine logic - if
    // a script is present but we can't do anything with it, it has no effect.
    // "Implicitly" refers to fact that scripts are derived automatically from
    // existing keys, and are present in memory, even without being explicitly
    // loaded (e.g. from a file).
    if (pubkey.IsCompressed()) {
        CScript script = GetScriptForDestination(WitnessV0KeyHash(key_id));
        // This does not use AddCScript, as it may be overridden.
        CScriptID id(script);
        mapScripts[id] = std::move(script);
    }
}